

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::operador_relacional(Sintatico *this)

{
  Sintatico *this_local;
  
  switch(this->tok) {
  case 4:
    eat(this,4);
    break;
  case 5:
    eat(this,5);
    break;
  case 6:
    eat(this,6);
    break;
  case 0x1c:
    eat(this,0x1c);
    break;
  case 0x1d:
    eat(this,0x1d);
    break;
  case 0x1e:
    eat(this,0x1e);
  }
  return;
}

Assistant:

void Sintatico::operador_relacional() {
  switch (tok) {
    case IGUAL     : eat(IGUAL)     ; break;
    case DIFERENTE : eat(DIFERENTE) ; break;
    case MENOR     : eat(MENOR)     ; break;
    case MENORIGUAL: eat(MENORIGUAL); break;
    case MAIORIGUAL: eat(MAIORIGUAL); break;
    case MAIOR     : eat(MAIOR)     ; break;
  }
}